

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOOLElimination.cpp
# Opt level: O0

void __thiscall
FOOLElimination::process
          (FOOLElimination *this,TermList ts,Context context,TermList *termResult,
          Formula **formulaResult)

{
  bool bVar1;
  Formula *pFVar2;
  undefined8 *in_RCX;
  byte in_DL;
  undefined8 in_RSI;
  undefined8 *in_R8;
  TermList unaff_retaddr;
  Formula **in_stack_00000bf0;
  TermList *in_stack_00000bf8;
  undefined1 in_stack_00000c07;
  Term *in_stack_00000c08;
  FOOLElimination *in_stack_00000c10;
  
  bVar1 = Kernel::TermList::isTerm((TermList *)0xb94073);
  if (bVar1) {
    Kernel::TermList::term((TermList *)0xb940bf);
    process(in_stack_00000c10,in_stack_00000c08,(Context)in_stack_00000c07,in_stack_00000bf8,
            in_stack_00000bf0);
  }
  else if ((in_DL & 1) == 1) {
    *in_RCX = in_RSI;
  }
  else {
    pFVar2 = toEquality(unaff_retaddr);
    *in_R8 = pFVar2;
  }
  return;
}

Assistant:

void FOOLElimination::process(TermList ts, Context context, TermList& termResult, Formula*& formulaResult) {
#if VDEBUG
  // A term can only be processed in a formula context if it has boolean sort
  // The opposite does not hold - a boolean term can stand in a term context
  TermList sort = SortHelper::getResultSort(ts, _varSorts);
  if (context == FORMULA_CONTEXT) {
    ASS_REP(sort == AtomicSort::boolSort(), ts.toString());
  }
#endif

  if (!ts.isTerm()) {
    if (context == TERM_CONTEXT) {
      termResult = ts;
    } else {
      formulaResult = toEquality(ts);
    }
    return;
  }

  process(ts.term(), context, termResult, formulaResult);

  if (context == FORMULA_CONTEXT) {
    return;
  }
  // preprocessing of the term does not affect the sort
  //ASS_EQ(sort, SortHelper::getResultSort(termResult, _varSorts));
  //TODO assert that it is a variant
}